

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

TRef fold_simplify_intsubaddadd_cancel(jit_State *J)

{
  IRRef1 IVar1;
  IRRef1 IVar2;
  IRRef1 IVar3;
  TRef TVar4;
  IRRef1 IVar5;
  
  TVar4 = 0;
  if (((((J->fold).ins.field_1.t.irt & 0x1f) != 0xe) &&
      (((J->fold).left[0].field_1.t.irt & 0x40) == 0)) &&
     (((J->fold).right[0].field_1.t.irt & 0x40) == 0)) {
    IVar1 = (J->fold).left[0].field_0.op1;
    IVar5 = (J->fold).right[0].field_0.op1;
    if (IVar1 == IVar5) {
      IVar5 = (J->fold).right[0].field_0.op2;
      (J->fold).ins.field_0.op1 = (J->fold).left[0].field_0.op2;
    }
    else {
      IVar2 = (J->fold).left[0].field_0.op2;
      IVar3 = (J->fold).right[0].field_0.op2;
      if (IVar1 == IVar3) {
        (J->fold).ins.field_0.op1 = IVar2;
      }
      else if (IVar2 == IVar5) {
        (J->fold).ins.field_0.op1 = IVar1;
        IVar5 = IVar3;
      }
      else {
        if (IVar2 != IVar3) {
          return 0;
        }
        (J->fold).ins.field_0.op1 = IVar1;
      }
    }
    (J->fold).ins.field_0.op2 = IVar5;
    TVar4 = 1;
  }
  return TVar4;
}

Assistant:

LJFOLD(SUB ADD ADD)
LJFOLDF(simplify_intsubaddadd_cancel)
{
  if (!irt_isnum(fins->t)) {
    PHIBARRIER(fleft);
    PHIBARRIER(fright);
    if (fleft->op1 == fright->op1) {  /* (i + j1) - (i + j2) ==> j1 - j2 */
      fins->op1 = fleft->op2;
      fins->op2 = fright->op2;
      return RETRYFOLD;
    }
    if (fleft->op1 == fright->op2) {  /* (i + j1) - (j2 + i) ==> j1 - j2 */
      fins->op1 = fleft->op2;
      fins->op2 = fright->op1;
      return RETRYFOLD;
    }
    if (fleft->op2 == fright->op1) {  /* (j1 + i) - (i + j2) ==> j1 - j2 */
      fins->op1 = fleft->op1;
      fins->op2 = fright->op2;
      return RETRYFOLD;
    }
    if (fleft->op2 == fright->op2) {  /* (j1 + i) - (j2 + i) ==> j1 - j2 */
      fins->op1 = fleft->op1;
      fins->op2 = fright->op1;
      return RETRYFOLD;
    }
  }
  return NEXTFOLD;
}